

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void procFix(void)

{
  int iVar1;
  procFixStruct *ppVar2;
  
  ppVar2 = procFixList;
  while( true ) {
    ppVar2 = ppVar2->next;
    if (ppVar2 == (procFixStruct *)0x0) {
      return;
    }
    iVar1 = ppVar2->proc->val;
    if (iVar1 < 0) break;
    fix(ppVar2->pos,iVar1 - ppVar2->pos);
  }
  mark("found lonley prototype");
  exit(-1);
}

Assistant:

procedure 
void procFix(void) {
	variable struct procFixStruct *list;
	list = procFixList->next;
	while (list != NULL) {
		if (list->proc->val < 0) {
			mark("found lonley prototype");
			exit(-1);
		} else {
			fix(list->pos,list->proc->val - list->pos);
		}
		list = list->next;
	}
}